

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::gen_index_which
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int forward,
          int count_only,vm_rcdesc *rc)

{
  vm_val_t *funcptr;
  char *pcVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  vm_obj_id_t vVar10;
  ulong uVar11;
  bool bVar12;
  
  if (gen_index_which(unsigned_int,vm_val_t*,unsigned_int*,int,int,vm_rcdesc*)::desc == '\0') {
    gen_index_which();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&gen_index_which::desc);
  pvVar3 = sp_;
  if (iVar4 != 0) {
    return 1;
  }
  funcptr = sp_ + -1;
  pvVar2 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar2 = VM_OBJ;
  (pvVar3->val).obj = self;
  retval->typ = VM_NIL;
  uVar6 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  vVar5 = 0;
  bVar12 = forward == 0;
  uVar7 = (ulong)!bVar12;
  uVar11 = 0;
  if (bVar12) {
    uVar11 = uVar6;
  }
  uVar9 = (ulong)bVar12;
  vVar10 = ((int)uVar11 - (uint)bVar12) + 1;
  lVar8 = (uVar11 - uVar9) * 5 + 4;
  do {
    pvVar3 = sp_;
    if (forward == 0) {
      if (uVar11 == 0) goto LAB_00295f09;
    }
    else if (uVar6 <= uVar11) goto LAB_00295f09;
    pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = (int)pcVar1[lVar8];
    vmb_get_dh_val(pcVar1 + lVar8,pvVar3);
    CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,rc,0);
    if ((r0_.typ != VM_NIL) && ((r0_.typ != VM_INT || (r0_.val.obj != 0)))) {
      if (count_only == 0) {
        retval->typ = VM_INT;
        (retval->val).obj = vVar10;
LAB_00295f09:
        sp_ = sp_ + -2;
        if (count_only == 0) {
          return 1;
        }
        retval->typ = VM_INT;
        (retval->val).obj = vVar5;
        return 1;
      }
      vVar5 = vVar5 + 1;
    }
    uVar11 = (uVar11 - uVar9) + uVar7;
    vVar10 = vVar10 + ((uint)!bVar12 - (uint)bVar12);
    lVar8 = lVar8 + (uVar7 - uVar9) * 5;
  } while( true );
}

Assistant:

int CVmObjVector::gen_index_which(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc, int forward, int count_only,
                                  vm_rcdesc *rc)
{
    const vm_val_t *func_val;
    size_t cnt;
    size_t idx;
    int val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* presume we won't find a matching element */
    retval->set_nil();
    val_cnt = 0;

    /* get the number of elements to visit */
    cnt = get_element_count();

    /* start at the first or last element, depending on direction */
    idx = (forward ? 0 : cnt);

    /*
     *   Go through each element of our vector, and invoke the callback on
     *   each element, looking for the first one that returns true.  
     */
    for (;;)
    {
        /* if we've reached the last element, we can stop looking */
        if (forward ? idx >= cnt : idx == 0)
            break;

        /* if we're going backwards, decrement the index */
        if (!forward)
            --idx;

        /* push the element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, rc, 0);

        /* 
         *   if the callback returned true, we've found the element we're
         *   looking for 
         */
        if (G_interpreter->get_r0()->typ == VM_NIL
            || (G_interpreter->get_r0()->typ == VM_INT
                && G_interpreter->get_r0()->val.intval == 0))
        {
            /* nil or zero - this one failed the test, so keep looking */
        }
        else
        {
            /* it passed the test - check what we're doing */
            if (count_only)
            {
                /* we only want the count */
                ++val_cnt;
            }
            else
            {
                /* we want the (1-based) index - return it */
                retval->set_int(idx + 1);
            
                /* found it - no need to keep looking */
                break;
            }
        }

        /* if we're going forwards, increment the index */
        if (forward)
            ++idx;
    }
    
    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count if desired */
    if (count_only)
        retval->set_int(val_cnt);
    
    /* handled */
    return TRUE;
}